

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O2

void __thiscall
Assimp::AssbinExport::WriteBinaryTexture(AssbinExport *this,IOStream *container,aiTexture *tex)

{
  int iVar1;
  AssbinChunkWriter chunk;
  
  chunk.super_IOStream._vptr_IOStream = (_func_int **)&PTR__AssbinChunkWriter_00758758;
  chunk.buffer = (uint8_t *)0x0;
  chunk.magic = 0x1236;
  chunk.cur_size = 0;
  chunk.cursor = 0;
  chunk.initial = 0x1000;
  chunk.container = container;
  Write<unsigned_int>(&chunk.super_IOStream,&tex->mWidth);
  Write<unsigned_int>(&chunk.super_IOStream,&tex->mHeight);
  AssbinChunkWriter::Write(&chunk,tex->achFormatHint,1,4);
  if (this->shortened == false) {
    iVar1 = 1;
    if (tex->mHeight != 0) {
      iVar1 = tex->mHeight * 4;
    }
    AssbinChunkWriter::Write(&chunk,tex->pcData,1,(ulong)(iVar1 * tex->mWidth));
  }
  AssbinChunkWriter::~AssbinChunkWriter(&chunk);
  return;
}

Assistant:

void WriteBinaryTexture(IOStream * container, const aiTexture* tex)
    {
        AssbinChunkWriter chunk( container, ASSBIN_CHUNK_AITEXTURE );

        Write<unsigned int>(&chunk,tex->mWidth);
        Write<unsigned int>(&chunk,tex->mHeight);
        chunk.Write( tex->achFormatHint, sizeof(char), 4 );

        if(!shortened) {
            if (!tex->mHeight) {
                chunk.Write(tex->pcData,1,tex->mWidth);
            }
            else {
                chunk.Write(tex->pcData,1,tex->mWidth*tex->mHeight*4);
            }
        }

    }